

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::exception_detail::clone_base_const>::
shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
          (shared_ptr<boost::exception_detail::clone_base_const> *this,
          clone_impl<boost::exception_detail::bad_exception_> *p)

{
  _func_int *p_Var1;
  
  if (p == (clone_impl<boost::exception_detail::bad_exception_> *)0x0) {
    p_Var1 = (_func_int *)0x0;
  }
  else {
    p_Var1 = (_func_int *)
             ((long)&(p->super_bad_exception_).super_exception._vptr_exception +
             (long)(p->super_bad_exception_).super_exception._vptr_exception[-3]);
  }
  *(_func_int **)this = p_Var1;
  *(undefined8 *)(this + 8) = 0;
  detail::
  sp_pointer_construct<boost::exception_detail::clone_base_const,boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
            ((shared_ptr<const_boost::exception_detail::clone_base> *)this,p,
             (shared_count *)(this + 8));
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }